

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

archive_entry * archive_entry_clone(archive_entry *entry)

{
  unsigned_long uVar1;
  archive_entry *entry_00;
  ae_sparse *paVar2;
  ae_xattr *paVar3;
  
  entry_00 = archive_entry_new2(entry->archive);
  if (entry_00 != (archive_entry *)0x0) {
    memcpy(&entry_00->ae_stat,&entry->ae_stat,0xa8);
    uVar1 = entry->ae_fflags_clear;
    entry_00->ae_fflags_set = entry->ae_fflags_set;
    entry_00->ae_fflags_clear = uVar1;
    archive_mstring_copy(&entry_00->ae_fflags_text,&entry->ae_fflags_text);
    archive_mstring_copy(&entry_00->ae_gname,&entry->ae_gname);
    archive_mstring_copy(&entry_00->ae_hardlink,&entry->ae_hardlink);
    archive_mstring_copy(&entry_00->ae_pathname,&entry->ae_pathname);
    archive_mstring_copy(&entry_00->ae_sourcepath,&entry->ae_sourcepath);
    archive_mstring_copy(&entry_00->ae_symlink,&entry->ae_symlink);
    entry_00->ae_set = entry->ae_set;
    archive_mstring_copy(&entry_00->ae_uname,&entry->ae_uname);
    entry_00->encryption = entry->encryption;
    archive_acl_copy(&entry_00->acl,&entry->acl);
    archive_entry_copy_mac_metadata(entry_00,entry->mac_metadata,entry->mac_metadata_size);
    paVar3 = (ae_xattr *)&entry->xattr_head;
    while (paVar3 = paVar3->next, paVar3 != (ae_xattr *)0x0) {
      archive_entry_xattr_add_entry(entry_00,paVar3->name,paVar3->value,paVar3->size);
    }
    paVar2 = (ae_sparse *)&entry->sparse_head;
    while (paVar2 = paVar2->next, paVar2 != (ae_sparse *)0x0) {
      archive_entry_sparse_add_entry(entry_00,paVar2->offset,paVar2->length);
    }
  }
  return entry_00;
}

Assistant:

struct archive_entry *
archive_entry_clone(struct archive_entry *entry)
{
	struct archive_entry *entry2;
	struct ae_xattr *xp;
	struct ae_sparse *sp;
	size_t s;
	const void *p;

	/* Allocate new structure and copy over all of the fields. */
	/* TODO: Should we copy the archive over?  Or require a new archive
	 * as an argument? */
	entry2 = archive_entry_new2(entry->archive);
	if (entry2 == NULL)
		return (NULL);
	entry2->ae_stat = entry->ae_stat;
	entry2->ae_fflags_set = entry->ae_fflags_set;
	entry2->ae_fflags_clear = entry->ae_fflags_clear;

	/* TODO: XXX If clone can have a different archive, what do we do here if
	 * character sets are different? XXX */
	archive_mstring_copy(&entry2->ae_fflags_text, &entry->ae_fflags_text);
	archive_mstring_copy(&entry2->ae_gname, &entry->ae_gname);
	archive_mstring_copy(&entry2->ae_hardlink, &entry->ae_hardlink);
	archive_mstring_copy(&entry2->ae_pathname, &entry->ae_pathname);
	archive_mstring_copy(&entry2->ae_sourcepath, &entry->ae_sourcepath);
	archive_mstring_copy(&entry2->ae_symlink, &entry->ae_symlink);
	entry2->ae_set = entry->ae_set;
	archive_mstring_copy(&entry2->ae_uname, &entry->ae_uname);

	/* Copy encryption status */
	entry2->encryption = entry->encryption;
	
	/* Copy ACL data over. */
	archive_acl_copy(&entry2->acl, &entry->acl);

	/* Copy Mac OS metadata. */
	p = archive_entry_mac_metadata(entry, &s);
	archive_entry_copy_mac_metadata(entry2, p, s);

	/* Copy xattr data over. */
	xp = entry->xattr_head;
	while (xp != NULL) {
		archive_entry_xattr_add_entry(entry2,
		    xp->name, xp->value, xp->size);
		xp = xp->next;
	}

	/* Copy sparse data over. */
	sp = entry->sparse_head;
	while (sp != NULL) {
		archive_entry_sparse_add_entry(entry2,
		    sp->offset, sp->length);
		sp = sp->next;
	}

	return (entry2);
}